

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InertiaNonLinearParametrization.cpp
# Opt level: O3

Matrix<double,_3,_3,_1,_3,_3> * iDynTree::unvecColMajor(Matrix<double,_9,_1,_0,_9,_1> *vec)

{
  Matrix<double,_3,_3,_1,_3,_3> *mat;
  Matrix<double,_3,_3,_1,_3,_3> *in_RDI;
  
  (in_RDI->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>).m_storage.m_data.array[0] =
       (vec->super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>).m_storage.m_data.array[0]
  ;
  (in_RDI->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>).m_storage.m_data.array[3] =
       (vec->super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>).m_storage.m_data.array[1]
  ;
  (in_RDI->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>).m_storage.m_data.array[6] =
       (vec->super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>).m_storage.m_data.array[2]
  ;
  (in_RDI->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>).m_storage.m_data.array[1] =
       (vec->super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>).m_storage.m_data.array[3]
  ;
  (in_RDI->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>).m_storage.m_data.array[4] =
       (vec->super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>).m_storage.m_data.array[4]
  ;
  (in_RDI->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>).m_storage.m_data.array[7] =
       (vec->super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>).m_storage.m_data.array[5]
  ;
  (in_RDI->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>).m_storage.m_data.array[2] =
       (vec->super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>).m_storage.m_data.array[6]
  ;
  (in_RDI->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>).m_storage.m_data.array[5] =
       (vec->super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>).m_storage.m_data.array[7]
  ;
  (in_RDI->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>).m_storage.m_data.array[8] =
       (vec->super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>).m_storage.m_data.array[8]
  ;
  return in_RDI;
}

Assistant:

Eigen::Matrix<double, 3, 3, Eigen::RowMajor> unvecColMajor(const Eigen::Matrix<double, 9, 1> & vec)
{
    Eigen::Matrix<double, 3, 3, Eigen::RowMajor> mat;

    mat(0,0) = vec(0);
    mat(1,0) = vec(1);
    mat(2,0) = vec(2);
    mat(0,1) = vec(3);
    mat(1,1) = vec(4);
    mat(2,1) = vec(5);
    mat(0,2) = vec(6);
    mat(1,2) = vec(7);
    mat(2,2) = vec(8);

    return mat;
}